

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

void __thiscall
duckdb::Deserializer::
ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::AtClause,std::default_delete<duckdb::AtClause>,true>>
          (Deserializer *this,field_id_t field_id,char *tag,
          unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>,_true> *ret)

{
  uint uVar1;
  __uniq_ptr_data<duckdb::AtClause,_std::default_delete<duckdb::AtClause>,_true,_true> in_RAX;
  _Head_base<0UL,_duckdb::AtClause_*,_false> __p;
  __uniq_ptr_impl<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_> local_28;
  
  local_28._M_t.super__Tuple_impl<0UL,_duckdb::AtClause_*,_std::default_delete<duckdb::AtClause>_>.
  super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl =
       (tuple<duckdb::AtClause_*,_std::default_delete<duckdb::AtClause>_>)
       (tuple<duckdb::AtClause_*,_std::default_delete<duckdb::AtClause>_>)
       in_RAX.super___uniq_ptr_impl<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::AtClause_*,_std::default_delete<duckdb::AtClause>_>.
       super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl;
  uVar1 = (*this->_vptr_Deserializer[4])();
  if ((char)uVar1 == '\0') {
    __p._M_head_impl = (AtClause *)0x0;
  }
  else {
    Read<duckdb::unique_ptr<duckdb::AtClause,std::default_delete<duckdb::AtClause>,true>,duckdb::AtClause>
              ((Deserializer *)&stack0xffffffffffffffd8);
    __p._M_head_impl =
         (AtClause *)
         local_28._M_t.
         super__Tuple_impl<0UL,_duckdb::AtClause_*,_std::default_delete<duckdb::AtClause>_>.
         super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl;
  }
  local_28._M_t.super__Tuple_impl<0UL,_duckdb::AtClause_*,_std::default_delete<duckdb::AtClause>_>.
  super__Head_base<0UL,_duckdb::AtClause_*,_false>._M_head_impl =
       (tuple<duckdb::AtClause_*,_std::default_delete<duckdb::AtClause>_>)0x0;
  ::std::__uniq_ptr_impl<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>::reset
            ((__uniq_ptr_impl<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_> *)ret,
             __p._M_head_impl);
  ::std::unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_>::~unique_ptr
            ((unique_ptr<duckdb::AtClause,_std::default_delete<duckdb::AtClause>_> *)
             &stack0xffffffffffffffd8);
  (*this->_vptr_Deserializer[5])(this,(ulong)(uVar1 & 0xff));
  return;
}

Assistant:

inline void ReadPropertyWithDefault(const field_id_t field_id, const char *tag, T &ret) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			ret = std::forward<T>(SerializationDefaultValue::GetDefault<T>());
			OnOptionalPropertyEnd(false);
			return;
		}
		ret = Read<T>();
		OnOptionalPropertyEnd(true);
	}